

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

MIR_reg_t vn_add_val(MIR_context_t ctx,MIR_func_t func,MIR_type_t type,MIR_insn_code_t code,
                    MIR_op_t op1,MIR_op_t op2)

{
  val_t el;
  val_t el_00;
  val_t *pvVar1;
  int iVar2;
  val_t val;
  val_t tab_val;
  
  val.op1.data = op1.data;
  val.op1._8_8_ = op1._8_8_;
  val.op1.u.i = op1.u.i;
  val.op1.u.str.s = op1.u.str.s;
  val.op1.u._16_8_ = op1.u._16_8_;
  val.op1.u.mem.disp = op1.u.mem.disp;
  val.op2.data = op2.data;
  val.op2._8_8_ = op2._8_8_;
  val.op2.u.i = op2.u.i;
  val.op2.u.str.s = op2.u.str.s;
  val.op2.u._16_8_ = op2.u._16_8_;
  val.op2.u.mem.disp = op2.u.mem.disp;
  el.type = type;
  el.code = code;
  el._116_4_ = val._116_4_;
  el.reg = val.reg;
  el._8_8_ = val._8_8_;
  el.op1.data = op1.data;
  el.op1._8_8_ = op1._8_8_;
  el.op1.u.i = op1.u.i;
  el.op1.u.str.s = op1.u.str.s;
  el.op1.u._16_8_ = op1.u._16_8_;
  el.op1.u.mem.disp = op1.u.mem.disp;
  el.op2.data = op2.data;
  el.op2._8_8_ = op2._8_8_;
  el.op2.u.i = op2.u.i;
  el.op2.u.str.s = op2.u.str.s;
  el.op2.u._16_8_ = op2.u._16_8_;
  el.op2.u.mem.disp = op2.u.mem.disp;
  el._120_8_ = val._120_8_;
  val.code = code;
  val.type = type;
  iVar2 = HTAB_val_t_do(ctx->simplify_ctx->val_tab,el,HTAB_FIND,&tab_val);
  if (iVar2 == 0) {
    val.reg = new_temp_reg(ctx,type,func);
    pvVar1 = &val;
    el_00.type = val.type;
    el_00.code = val.code;
    el_00._116_4_ = val._116_4_;
    el_00.reg = val.reg;
    el_00._8_8_ = val._8_8_;
    el_00.op1.data = val.op1.data;
    el_00.op1._8_8_ = val.op1._8_8_;
    el_00.op1.u.i = val.op1.u.i;
    el_00.op1.u.str.s = val.op1.u.str.s;
    el_00.op1.u._16_8_ = val.op1.u._16_8_;
    el_00.op1.u.mem.disp = val.op1.u.mem.disp;
    el_00.op2.data = val.op2.data;
    el_00.op2._8_8_ = val.op2._8_8_;
    el_00.op2.u.i = val.op2.u.i;
    el_00.op2.u.str.s = val.op2.u.str.s;
    el_00.op2.u._16_8_ = val.op2.u._16_8_;
    el_00.op2.u.mem.disp = val.op2.u.mem.disp;
    el_00._120_8_ = val._120_8_;
    HTAB_val_t_do(ctx->simplify_ctx->val_tab,el_00,HTAB_INSERT,&tab_val);
  }
  else {
    pvVar1 = &tab_val;
  }
  return pvVar1->reg;
}

Assistant:

static MIR_reg_t vn_add_val (MIR_context_t ctx, MIR_func_t func, MIR_type_t type,
                             MIR_insn_code_t code, MIR_op_t op1, MIR_op_t op2) {
  val_t val, tab_val;

  val.type = type;
  val.code = code;
  val.op1 = op1;
  val.op2 = op2;
  if (HTAB_DO (val_t, val_tab, val, HTAB_FIND, tab_val)) return tab_val.reg;
  val.reg = new_temp_reg (ctx, type, func);
  HTAB_DO (val_t, val_tab, val, HTAB_INSERT, tab_val);
  return val.reg;
}